

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O1

string * duckdb::ParseString(string *__return_storage_ptr__,Value *value,string *loption)

{
  LogicalTypeId LVar1;
  pointer pcVar2;
  vector<duckdb::Value,_true> *this;
  BinderException *pBVar3;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  while( true ) {
    if (value->is_null == true) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    LVar1 = (value->type_).id_;
    if (LVar1 != LIST) break;
    this = ListValue::GetChildren(value);
    if ((long)(this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_start != 0x40) {
      pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"\"%s\" expects a single argument as a string value","");
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      pcVar2 = (loption->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar2,pcVar2 + loption->_M_string_length);
      BinderException::BinderException<std::__cxx11::string>(pBVar3,&local_88,&local_48);
      __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    value = vector<duckdb::Value,_true>::operator[](this,0);
  }
  if (LVar1 == VARCHAR) {
    Value::GetValue<std::__cxx11::string>(__return_storage_ptr__,value);
    return __return_storage_ptr__;
  }
  pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"\"%s\" expects a string argument!","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  pcVar2 = (loption->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + loption->_M_string_length);
  BinderException::BinderException<std::__cxx11::string>(pBVar3,&local_88,&local_68);
  __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static string ParseString(const Value &value, const string &loption) {
	if (value.IsNull()) {
		return string();
	}
	if (value.type().id() == LogicalTypeId::LIST) {
		auto &children = ListValue::GetChildren(value);
		if (children.size() != 1) {
			throw BinderException("\"%s\" expects a single argument as a string value", loption);
		}
		return ParseString(children[0], loption);
	}
	if (value.type().id() != LogicalTypeId::VARCHAR) {
		throw BinderException("\"%s\" expects a string argument!", loption);
	}
	return value.GetValue<string>();
}